

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O2

int mdb_page_merge(MDB_cursor *csrc,MDB_cursor *cdst)

{
  long *plVar1;
  short *psVar2;
  uint16_t uVar3;
  MDB_page *pMVar4;
  MDB_page *pMVar5;
  MDB_cursor *pMVar6;
  MDB_ID id;
  MDB_txn *pMVar7;
  MDB_ID2L ids;
  MDB_xcursor *pMVar8;
  short sVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  MDB_cursor *pMVar13;
  unsigned_short uVar14;
  ulong uVar15;
  MDB_xcursor *pMVar16;
  ulong uVar17;
  MDB_cursor *pMVar18;
  int in_R8D;
  uint6 *puVar19;
  ushort uVar20;
  MDB_val data;
  MDB_cursor mn;
  MDB_val local_1e0;
  MDB_cursor *local_1d0;
  MDB_val local_1c8;
  MDB_cursor local_1b8;
  
  if (csrc->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"csrc->mc_snum > 1","mdb_page_merge",(char *)0x21e6,in_R8D)
    ;
  }
  if (cdst->mc_snum < 2) {
    mdb_assert_fail(csrc->mc_txn->mt_env,"cdst->mc_snum > 1","mdb_page_merge",(char *)0x21e7,in_R8D)
    ;
  }
  pMVar4 = csrc->mc_pg[csrc->mc_top];
  iVar10 = mdb_page_touch(cdst);
  if (iVar10 != 0) {
    return iVar10;
  }
  local_1d0 = (MDB_cursor *)cdst->mc_pg[cdst->mc_top];
  sVar9 = (short)((((anon_union_4_2_fd2437e6_for_mp_pb *)((long)&local_1d0->mc_backup + 4))->pb).
                  pb_lower + 0x1fff0 >> 1);
  if ((pMVar4->mp_flags & 0x20) == 0) {
    for (uVar20 = 0; (uint)uVar20 < (pMVar4->mp_pb).pb.pb_lower - 0x10 >> 1; uVar20 = uVar20 + 1) {
      puVar19 = (uint6 *)((long)pMVar4->mp_ptrs + ((ulong)pMVar4->mp_ptrs[(uint)uVar20] - 0x10));
      if ((uVar20 == 0) && ((pMVar4->mp_flags & 1) != 0)) {
        mdb_cursor_copy(csrc,&local_1b8);
        local_1b8.mc_xcursor = (MDB_xcursor *)0x0;
        iVar10 = mdb_page_search_lowest(&local_1b8);
        if (iVar10 != 0) {
          return iVar10;
        }
        pMVar5 = local_1b8.mc_pg[local_1b8.mc_top];
        if ((pMVar5->mp_flags & 0x20) == 0) {
          local_1e0.mv_data = (void *)((long)pMVar5->mp_ptrs + ((ulong)pMVar5->mp_ptrs[0] - 8));
          local_1e0.mv_size =
               (size_t)*(ushort *)((long)pMVar5->mp_ptrs + ((ulong)pMVar5->mp_ptrs[0] - 10));
        }
        else {
          local_1e0.mv_size = (size_t)(local_1b8.mc_db)->md_pad;
          local_1e0.mv_data = pMVar5->mp_ptrs;
        }
        uVar12 = (ulong)*(ushort *)((long)puVar19 + 6);
      }
      else {
        uVar12 = (ulong)*(ushort *)((long)puVar19 + 6);
        local_1e0.mv_data = puVar19 + 1;
        local_1e0.mv_size = uVar12;
      }
      local_1c8.mv_size = (size_t)(uint)*puVar19;
      local_1c8.mv_data = (void *)((long)puVar19 + uVar12 + 8);
      iVar10 = mdb_node_add(cdst,uVar20 + sVar9,&local_1e0,&local_1c8,(ulong)*puVar19,
                            (uint)*(ushort *)((long)puVar19 + 4));
      if (iVar10 != 0) {
        return iVar10;
      }
    }
  }
  else {
    local_1e0.mv_size = (size_t)csrc->mc_db->md_pad;
    local_1e0.mv_data = pMVar4->mp_ptrs;
    for (uVar20 = 0; (uint)uVar20 < (pMVar4->mp_pb).pb.pb_lower - 0x10 >> 1; uVar20 = uVar20 + 1) {
      iVar10 = mdb_node_add(cdst,sVar9 + uVar20,&local_1e0,(MDB_val *)0x0,0,0);
      if (iVar10 != 0) {
        return iVar10;
      }
      local_1e0.mv_data = (void *)((long)local_1e0.mv_data + local_1e0.mv_size);
    }
  }
  csrc->mc_top = csrc->mc_top - 1;
  mdb_node_del(csrc,0);
  uVar20 = csrc->mc_top;
  if (csrc->mc_ki[uVar20] == 0) {
    local_1e0.mv_size = 0;
    iVar10 = mdb_update_key(csrc,&local_1e0);
    uVar20 = csrc->mc_top;
    if (iVar10 != 0) {
      csrc->mc_top = uVar20 + 1;
      return iVar10;
    }
  }
  csrc->mc_top = uVar20 + 1;
  pMVar6 = (MDB_cursor *)csrc->mc_pg[(ushort)(uVar20 + 1)];
  id = ((anon_union_8_2_b62042e6_for_mp_p *)&pMVar6->mc_next)->p_pgno;
  pMVar7 = csrc->mc_txn;
  uVar20 = *(uint16_t *)((long)&pMVar6->mc_backup + 2);
  if (((uVar20 & 0x10) != 0) && (csrc->mc_dbi != 0)) {
    if (pMVar7->mt_parent == (MDB_txn *)0x0) {
LAB_0010cfd4:
      pMVar6->mc_dbx = (MDB_dbx *)pMVar7->mt_loose_pgs;
      pMVar7->mt_loose_pgs = (MDB_page *)pMVar6;
      pMVar7->mt_loose_count = pMVar7->mt_loose_count + 1;
      uVar11 = uVar20 | 0x4000;
      *(uint16_t *)((long)&pMVar6->mc_backup + 2) = (uint16_t)uVar11;
      goto LAB_0010cfee;
    }
    ids = (pMVar7->mt_u).dirty_list;
    if (ids->mid != 0) {
      uVar11 = mdb_mid2l_search(ids,id);
      uVar12 = (ulong)uVar11;
      if ((uVar12 <= ids->mid) && (ids[uVar12].mid == id)) {
        if ((MDB_cursor *)ids[uVar12].mptr != pMVar6) {
          *(byte *)&csrc->mc_flags = (byte)csrc->mc_flags & 0xfc;
          *(byte *)&pMVar7->mt_flags = (byte)pMVar7->mt_flags | 2;
          return -0x784c;
        }
        uVar20 = *(uint16_t *)((long)&pMVar6->mc_backup + 2);
        goto LAB_0010cfd4;
      }
    }
  }
  iVar10 = mdb_midl_append(&pMVar7->mt_free_pgs,id);
  if (iVar10 != 0) {
    return iVar10;
  }
  uVar11 = (uint)*(uint16_t *)((long)&pMVar6->mc_backup + 2);
LAB_0010cfee:
  plVar1 = (long *)((long)&csrc->mc_db->md_branch_pages + (ulong)(uVar11 & 2) * 4);
  *plVar1 = *plVar1 + -1;
  uVar12 = (ulong)csrc->mc_top;
  pMVar13 = (MDB_cursor *)(csrc->mc_txn->mt_cursors + csrc->mc_dbi);
  uVar15 = (ulong)(csrc->mc_top - 1);
  while (pMVar13 = pMVar13->mc_next, pMVar13 != (MDB_cursor *)0x0) {
    pMVar16 = (MDB_xcursor *)pMVar13;
    if ((csrc->mc_flags & 4) != 0) {
      pMVar16 = pMVar13->mc_xcursor;
    }
    if ((pMVar16 != (MDB_xcursor *)csrc) &&
       (csrc->mc_snum <= *(unsigned_short *)((long)&pMVar16->mx_cursor + 0x40))) {
      pMVar18 = *(MDB_cursor **)((long)&pMVar16->mx_cursor + (uVar12 + 9) * 8);
      if (pMVar18 == pMVar6) {
        *(MDB_cursor **)((long)&pMVar16->mx_cursor + (uVar12 + 9) * 8) = local_1d0;
        psVar2 = (short *)((long)&pMVar16->mx_cursor + uVar12 * 2 + 0x148);
        *psVar2 = *psVar2 + sVar9;
        *(indx_t *)((long)&pMVar16->mx_cursor + uVar15 * 2 + 0x148) = cdst->mc_ki[uVar15];
        pMVar18 = local_1d0;
      }
      else if ((*(MDB_cursor **)((long)&pMVar16->mx_cursor + (uVar15 + 9) * 8) ==
                (MDB_cursor *)csrc->mc_pg[uVar15]) &&
              (uVar20 = *(ushort *)((long)&pMVar16->mx_cursor + uVar15 * 2 + 0x148),
              csrc->mc_ki[uVar15] < uVar20)) {
        *(ushort *)((long)&pMVar16->mx_cursor + uVar15 * 2 + 0x148) = uVar20 - 1;
      }
      pMVar8 = *(MDB_xcursor **)((long)&pMVar16->mx_cursor + 0x10);
      if ((((pMVar8 != (MDB_xcursor *)0x0) && (((pMVar8->mx_cursor).mc_flags & 1) != 0)) &&
          (((ulong)pMVar6->mc_backup & 0x20000) != 0)) &&
         (uVar17 = (ulong)*(indx_t *)
                           ((long)&pMVar18->mc_xcursor +
                           (ulong)*(ushort *)((long)&pMVar16->mx_cursor + uVar12 * 2 + 0x148) * 2),
         (*(ushort *)((long)pMVar18->mc_pg + (uVar17 - 0x44)) & 6) == 4)) {
        (pMVar8->mx_cursor).mc_pg[0] =
             (MDB_page *)
             ((long)pMVar18->mc_pg +
             *(ushort *)((long)pMVar18->mc_pg + (uVar17 - 0x42)) + uVar17 + -0x40);
      }
    }
  }
  uVar14 = cdst->mc_snum;
  uVar3 = cdst->mc_db->md_depth;
  mdb_cursor_pop(cdst);
  iVar10 = mdb_rebalance(cdst);
  uVar14 = (cdst->mc_db->md_depth - uVar3) + uVar14;
  cdst->mc_snum = uVar14;
  cdst->mc_top = uVar14 - 1;
  return iVar10;
}

Assistant:

static int
mdb_page_merge(MDB_cursor *csrc, MDB_cursor *cdst)
{
	MDB_page	*psrc, *pdst;
	MDB_node	*srcnode;
	MDB_val		 key, data;
	unsigned	 nkeys;
	int			 rc;
	indx_t		 i, j;

	psrc = csrc->mc_pg[csrc->mc_top];
	pdst = cdst->mc_pg[cdst->mc_top];

	DPRINTF(("merging page %"Y"u into %"Y"u", psrc->mp_pgno, pdst->mp_pgno));

	mdb_cassert(csrc, csrc->mc_snum > 1);	/* can't merge root page */
	mdb_cassert(csrc, cdst->mc_snum > 1);

	/* Mark dst as dirty. */
	if ((rc = mdb_page_touch(cdst)))
		return rc;

	/* get dst page again now that we've touched it. */
	pdst = cdst->mc_pg[cdst->mc_top];

	/* Move all nodes from src to dst.
	 */
	j = nkeys = NUMKEYS(pdst);
	if (IS_LEAF2(psrc)) {
		key.mv_size = csrc->mc_db->md_pad;
		key.mv_data = METADATA(psrc);
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			rc = mdb_node_add(cdst, j, &key, NULL, 0, 0);
			if (rc != MDB_SUCCESS)
				return rc;
			key.mv_data = (char *)key.mv_data + key.mv_size;
		}
	} else {
		for (i = 0; i < NUMKEYS(psrc); i++, j++) {
			srcnode = NODEPTR(psrc, i);
			if (i == 0 && IS_BRANCH(psrc)) {
				MDB_cursor mn;
				MDB_node *s2;
				mdb_cursor_copy(csrc, &mn);
				mn.mc_xcursor = NULL;
				/* must find the lowest key below src */
				rc = mdb_page_search_lowest(&mn);
				if (rc)
					return rc;
				if (IS_LEAF2(mn.mc_pg[mn.mc_top])) {
					key.mv_size = mn.mc_db->md_pad;
					key.mv_data = LEAF2KEY(mn.mc_pg[mn.mc_top], 0, key.mv_size);
				} else {
					s2 = NODEPTR(mn.mc_pg[mn.mc_top], 0);
					key.mv_size = NODEKSZ(s2);
					key.mv_data = NODEKEY(s2);
				}
			} else {
				key.mv_size = srcnode->mn_ksize;
				key.mv_data = NODEKEY(srcnode);
			}

			data.mv_size = NODEDSZ(srcnode);
			data.mv_data = NODEDATA(srcnode);
			rc = mdb_node_add(cdst, j, &key, &data, NODEPGNO(srcnode), srcnode->mn_flags);
			if (rc != MDB_SUCCESS)
				return rc;
		}
	}

	DPRINTF(("dst page %"Y"u now has %u keys (%.1f%% filled)",
	    pdst->mp_pgno, NUMKEYS(pdst),
		(float)PAGEFILL(cdst->mc_txn->mt_env, pdst) / 10));

	/* Unlink the src page from parent and add to free list.
	 */
	csrc->mc_top--;
	mdb_node_del(csrc, 0);
	if (csrc->mc_ki[csrc->mc_top] == 0) {
		key.mv_size = 0;
		rc = mdb_update_key(csrc, &key);
		if (rc) {
			csrc->mc_top++;
			return rc;
		}
	}
	csrc->mc_top++;

	psrc = csrc->mc_pg[csrc->mc_top];
	/* If not operating on FreeDB, allow this page to be reused
	 * in this txn. Otherwise just add to free list.
	 */
	rc = mdb_page_loose(csrc, psrc);
	if (rc)
		return rc;
	if (IS_LEAF(psrc))
		csrc->mc_db->md_leaf_pages--;
	else
		csrc->mc_db->md_branch_pages--;
	{
		/* Adjust other cursors pointing to mp */
		MDB_cursor *m2, *m3;
		MDB_dbi dbi = csrc->mc_dbi;
		unsigned int top = csrc->mc_top;

		for (m2 = csrc->mc_txn->mt_cursors[dbi]; m2; m2=m2->mc_next) {
			if (csrc->mc_flags & C_SUB)
				m3 = &m2->mc_xcursor->mx_cursor;
			else
				m3 = m2;
			if (m3 == csrc) continue;
			if (m3->mc_snum < csrc->mc_snum) continue;
			if (m3->mc_pg[top] == psrc) {
				m3->mc_pg[top] = pdst;
				m3->mc_ki[top] += nkeys;
				m3->mc_ki[top-1] = cdst->mc_ki[top-1];
			} else if (m3->mc_pg[top-1] == csrc->mc_pg[top-1] &&
				m3->mc_ki[top-1] > csrc->mc_ki[top-1]) {
				m3->mc_ki[top-1]--;
			}
			if (m3->mc_xcursor && (m3->mc_xcursor->mx_cursor.mc_flags & C_INITIALIZED) &&
				IS_LEAF(psrc)) {
				MDB_node *node = NODEPTR(m3->mc_pg[top], m3->mc_ki[top]);
				if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) == F_DUPDATA)
					m3->mc_xcursor->mx_cursor.mc_pg[0] = NODEDATA(node);
			}
		}
	}
	{
		unsigned int snum = cdst->mc_snum;
		uint16_t depth = cdst->mc_db->md_depth;
		mdb_cursor_pop(cdst);
		rc = mdb_rebalance(cdst);
		/* Did the tree height change? */
		if (depth != cdst->mc_db->md_depth)
			snum += cdst->mc_db->md_depth - depth;
		cdst->mc_snum = snum;
		cdst->mc_top = snum-1;
	}
	return rc;
}